

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLString.cpp
# Opt level: O0

String * MathML::StringUtil::replaceAll(String *str,char pattern,char replacement)

{
  undefined1 *puVar1;
  undefined1 in_CL;
  char in_DL;
  string *in_RSI;
  String *in_RDI;
  size_t position;
  String *string;
  undefined8 local_20;
  
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  local_20 = std::__cxx11::string::find((char)in_RDI,(ulong)(uint)(int)in_DL);
  while (local_20 != -1) {
    puVar1 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
    *puVar1 = in_CL;
    local_20 = std::__cxx11::string::find((char)in_RDI,(ulong)(uint)(int)in_DL);
  }
  return in_RDI;
}

Assistant:

MathML::String StringUtil::replaceAll( const String& str, char pattern, char replacement )
    {
        String string = str;

        size_t position = string.find( pattern );

        while ( position != String::npos )
        {
            string[ position ] = replacement;
            position = string.find( pattern );
        }

        return string;
    }